

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall duckdb::DatabaseInstance::LoadExtensionSettings(DatabaseInstance *this)

{
  key_type *__k;
  DBConfigOptions *pDVar1;
  bool bVar2;
  iterator iVar3;
  type context;
  InternalException *this_00;
  InvalidInputException *pIVar4;
  ExtensionEntry (*entries) [62];
  _Hash_node_base *p_Var5;
  __node_base _Var6;
  string extension_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  options;
  __alloc_node_gen_t __alloc_node_gen;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  extension_options;
  case_insensitive_map_t<Value> unrecognized_options_copy;
  string local_168;
  string local_148;
  string local_128;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_128._M_dataplus._M_p = (pointer)&local_68;
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count = (this->config).options.unrecognized_options._M_h._M_bucket_count;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  entries = (ExtensionEntry (*) [62])
            (this->config).options.unrecognized_options._M_h._M_element_count;
  pDVar1 = &(this->config).options;
  local_68._M_rehash_policy._M_max_load_factor =
       (pDVar1->unrecognized_options)._M_h._M_rehash_policy._M_max_load_factor;
  local_68._M_rehash_policy._4_4_ =
       *(undefined4 *)&(pDVar1->unrecognized_options)._M_h._M_rehash_policy.field_0x4;
  local_68._M_rehash_policy._M_next_resize =
       (this->config).options.unrecognized_options._M_h._M_rehash_policy._M_next_resize;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_68._M_element_count = (size_type)entries;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::Value>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_128._M_dataplus._M_p,&(this->config).options.unrecognized_options._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
              *)&local_128);
  if ((this->config).options.autoload_known_extensions == true) {
    if ((ExtensionEntry (*) [62])local_68._M_element_count == (ExtensionEntry (*) [62])0x0)
    goto LAB_0165b223;
    Connection::Connection((Connection *)&local_128,this);
    Connection::BeginTransaction((Connection *)&local_128);
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var6._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        __k = (key_type *)(_Var6._M_nxt + 1);
        ExtensionHelper::FindExtensionInEntries<62ul>
                  (&local_168,(ExtensionHelper *)__k,(string *)"azure_account_name",entries);
        if (local_168._M_string_length != 0) {
          bVar2 = ExtensionHelper::TryAutoLoadExtension(this,&local_168);
          if (!bVar2) {
            pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,
                       "To set the %s setting, the %s extension needs to be loaded. But it could not be autoloaded."
                       ,"");
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,_Var6._M_nxt[1]._M_nxt,
                       (long)&(_Var6._M_nxt[1]._M_nxt)->_M_nxt +
                       (long)&(_Var6._M_nxt[2]._M_nxt)->_M_nxt);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,local_168._M_dataplus._M_p,
                       local_168._M_dataplus._M_p + local_168._M_string_length);
            InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                      (pIVar4,&local_148,&local_88,&local_a8);
            __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          iVar3 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(this->config).extension_parameters._M_h,__k);
          if (iVar3.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_true>
              ._M_cur == (__node_type *)0x0) {
            this_00 = (InternalException *)__cxa_allocate_exception(0x10);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"Extension %s did not provide the \'%s\' config setting"
                       ,"");
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,local_168._M_dataplus._M_p,
                       local_168._M_dataplus._M_p + local_168._M_string_length);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,_Var6._M_nxt[1]._M_nxt,
                       (long)&(_Var6._M_nxt[1]._M_nxt)->_M_nxt +
                       (long)&(_Var6._M_nxt[2]._M_nxt)->_M_nxt);
            InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                      (this_00,&local_148,&local_c8,&local_e8);
            __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          context = shared_ptr<duckdb::ClientContext,_true>::operator*
                              ((shared_ptr<duckdb::ClientContext,_true> *)&local_128);
          entries = (ExtensionEntry (*) [62])0x3;
          PhysicalSet::SetExtensionVariable
                    (context,(ExtensionOption *)
                             ((long)iVar3.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_true>
                                    ._M_cur + 0x28),__k,GLOBAL,(Value *)(_Var6._M_nxt + 5));
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_108,__k);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p);
        }
        _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt;
      } while (_Var6._M_nxt != (_Hash_node_base *)0x0);
    }
    Connection::Commit((Connection *)&local_128);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_108);
    Connection::~Connection((Connection *)&local_128);
  }
  if ((this->config).options.unrecognized_options._M_h._M_element_count != 0) {
    p_Var5 = (this->config).options.unrecognized_options._M_h._M_before_begin._M_nxt;
    local_148._M_dataplus._M_p = (pointer)0x0;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity = 0;
    if (p_Var5 != (_Hash_node_base *)0x0) {
      do {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_148,(value_type *)(p_Var5 + 1));
        p_Var5 = p_Var5->_M_nxt;
      } while (p_Var5 != (_Hash_node_base *)0x0);
    }
    local_168.field_2._M_allocated_capacity._0_2_ = 0x202c;
    local_168._M_string_length = 2;
    local_168.field_2._M_local_buf[2] = '\0';
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    StringUtil::Join(&local_128,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)&local_148,(string *)&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_168,"The following options were not recognized: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                    );
    InvalidInputException::InvalidInputException(pIVar4,(string *)&local_168);
    __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_0165b223:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void DatabaseInstance::LoadExtensionSettings() {
	// copy the map, to protect against modifications during
	auto unrecognized_options_copy = config.options.unrecognized_options;

	if (config.options.autoload_known_extensions) {
		if (unrecognized_options_copy.empty()) {
			// Nothing to do
			return;
		}

		Connection con(*this);
		con.BeginTransaction();

		vector<string> extension_options;
		for (auto &option : unrecognized_options_copy) {
			auto &name = option.first;
			auto &value = option.second;

			auto extension_name = ExtensionHelper::FindExtensionInEntries(name, EXTENSION_SETTINGS);
			if (extension_name.empty()) {
				continue;
			}
			if (!ExtensionHelper::TryAutoLoadExtension(*this, extension_name)) {
				throw InvalidInputException(
				    "To set the %s setting, the %s extension needs to be loaded. But it could not be autoloaded.", name,
				    extension_name);
			}
			auto it = config.extension_parameters.find(name);
			if (it == config.extension_parameters.end()) {
				throw InternalException("Extension %s did not provide the '%s' config setting", extension_name, name);
			}
			// if the extension provided the option, it should no longer be unrecognized.
			D_ASSERT(config.options.unrecognized_options.find(name) == config.options.unrecognized_options.end());
			auto &context = *con.context;
			PhysicalSet::SetExtensionVariable(context, it->second, name, SetScope::GLOBAL, value);
			extension_options.push_back(name);
		}

		con.Commit();
	}
	if (!config.options.unrecognized_options.empty()) {
		ThrowExtensionSetUnrecognizedOptions(config.options.unrecognized_options);
	}
}